

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMUnaryOp.cpp
# Opt level: O2

void __thiscall xercesc_4_0::CMUnaryOp::calcFirstPos(CMUnaryOp *this,CMStateSet *toSet)

{
  CMStateSet *srcSet;
  
  srcSet = CMNode::getFirstPos(this->fChild);
  CMStateSet::operator=(toSet,srcSet);
  return;
}

Assistant:

void CMUnaryOp::calcFirstPos(CMStateSet& toSet) const
{
    // Its just based on our child node's first pos
    toSet = fChild->getFirstPos();
}